

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sst_comm.cpp
# Opt level: O0

int anon_unknown.dwarf_df27d1::SMPI_Gather_Impl<char>
              (char *sendbuf,int sendcount,void *recvbuf,int recvcount,SMPI_Datatype recvtype,
              int root,SMPI_Comm comm)

{
  size_t sendcount_00;
  Comm *this;
  int in_ECX;
  char *in_RDX;
  int in_ESI;
  unsigned_long *in_RDI;
  undefined4 in_R8D;
  string *in_stack_00000008;
  undefined8 in_stack_fffffffffffffe40;
  int root_00;
  size_t in_stack_fffffffffffffe48;
  long *in_stack_fffffffffffffe50;
  size_t in_stack_fffffffffffffe58;
  char *in_stack_fffffffffffffe60;
  Comm *in_stack_fffffffffffffe68;
  string *in_stack_fffffffffffffe80;
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [48];
  string local_48 [72];
  
  root_00 = (int)((ulong)in_stack_fffffffffffffe40 >> 0x20);
  switch(in_R8D) {
  case 0:
    std::__cxx11::string::string(local_48);
    adios2::helper::Comm::Gather<char,int>
              (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
               (int *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,root_00,
               in_stack_fffffffffffffe80);
    std::__cxx11::string::~string(local_48);
    break;
  case 1:
    std::__cxx11::string::string(local_98);
    adios2::helper::Comm::Gather<char,long>
              (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
               in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,root_00,in_stack_00000008);
    std::__cxx11::string::~string(local_98);
    break;
  case 2:
    sendcount_00 = (size_t)in_ESI;
    this = (Comm *)(long)in_ECX;
    std::__cxx11::string::string(local_b8);
    adios2::helper::Comm::Gather<char,unsigned_long>
              (this,in_RDX,sendcount_00,in_RDI,(size_t)in_stack_00000008,
               (int)((ulong)local_b8 >> 0x20),in_stack_fffffffffffffe80);
    std::__cxx11::string::~string(local_b8);
    break;
  case 3:
    std::__cxx11::string::string(local_78);
    adios2::helper::Comm::Gather<char,char>
              (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
               (char *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,root_00,
               in_stack_fffffffffffffe80);
    std::__cxx11::string::~string(local_78);
    break;
  case 4:
    std::__cxx11::string::string(local_d8);
    adios2::helper::Comm::Gather<char,unsigned_char>
              (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
               (uchar *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,root_00,
               in_stack_fffffffffffffe80);
    std::__cxx11::string::~string(local_d8);
  }
  return 0;
}

Assistant:

int SMPI_Gather_Impl(const TSend *sendbuf, int sendcount, void *recvbuf, int recvcount,
                     SMPI_Datatype recvtype, int root, SMPI_Comm comm)
{
    switch (recvtype)
    {
#define F(type) comm->Gather(sendbuf, sendcount, static_cast<type *>(recvbuf), recvcount, root)
        CASE_FOR_EACH_TYPE(F);
#undef F
    }
    return 0;
}